

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

int cvui::internal::iarea(int theX,int theY,int theWidth,int theHeight)

{
  bool bVar1;
  cvui_context_t *pcVar2;
  int iVar3;
  int iVar4;
  allocator<char> local_51;
  String local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  pcVar2 = getContext(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_50._M_dataplus._M_p._0_4_ = theX;
  local_50._M_dataplus._M_p._4_4_ = theY;
  local_50._M_string_length._0_4_ = theWidth;
  local_50._M_string_length._4_4_ = theHeight;
  bVar1 = cv::Rect_<int>::contains((Rect_<int> *)&local_50,&(pcVar2->mouse).position);
  iVar4 = ((byte)~(pcVar2->mouse).anyButton.pressed & 1) * 2 + 2;
  if (!bVar1) {
    iVar4 = 5;
  }
  iVar3 = 3;
  if (((pcVar2->mouse).anyButton.justReleased & 1U) == 0) {
    iVar3 = iVar4;
  }
  if (!bVar1) {
    iVar3 = 5;
  }
  return iVar3;
}

Assistant:

int iarea(int theX, int theY, int theWidth, int theHeight) {
		cvui_mouse_t& aMouse = internal::getContext().mouse;

		// By default, return that the mouse is out of the interaction area.
		int aRet = cvui::OUT;

		// Check if the mouse is over the interaction area.
		bool aMouseIsOver = cv::Rect(theX, theY, theWidth, theHeight).contains(aMouse.position);

		if (aMouseIsOver) {
			if (aMouse.anyButton.pressed) {
				aRet = cvui::DOWN;
			} else {
				aRet = cvui::OVER;
			}
		}

		// Tell if the button was clicked or not
		if (aMouseIsOver && aMouse.anyButton.justReleased) {
			aRet = cvui::CLICK;
		}

		return aRet;
	}